

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManSupportNodes(Aig_Man_t *p,Vec_Ptr_t *vParts)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Int_t *vSupport;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  
  Aig_ManSetCioIds(p);
  uVar1 = vParts->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar9 = 8;
  if (6 < uVar1 - 1) {
    uVar9 = (ulong)uVar1;
  }
  pVVar3->nSize = 0;
  iVar8 = (int)uVar9;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar3->pArray = ppvVar4;
  if (0 < (int)uVar1) {
    uVar7 = 0;
    do {
      pvVar2 = vParts->pArray[uVar7];
      vSupport = (Vec_Int_t *)malloc(0x10);
      vSupport->nCap = 100;
      vSupport->nSize = 0;
      piVar5 = (int *)malloc(400);
      vSupport->pArray = piVar5;
      Aig_ManIncrementTravId(p);
      p->pConst1->TravId = p->nTravIds;
      if (0 < *(int *)((long)pvVar2 + 4)) {
        lVar10 = 0;
        do {
          iVar8 = *(int *)(*(long *)((long)pvVar2 + 8) + lVar10 * 4);
          if (((long)iVar8 < 0) || (p->vCos->nSize <= iVar8)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Aig_ManSupportNodes_rec
                    (p,(Aig_Obj_t *)
                       (*(ulong *)((long)p->vCos->pArray[iVar8] + 8) & 0xfffffffffffffffe),vSupport)
          ;
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)((long)pvVar2 + 4));
      }
      iVar8 = (int)uVar9;
      if ((int)uVar7 == iVar8) {
        if (iVar8 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = 0x10;
          uVar9 = 0x10;
        }
        else {
          uVar9 = (ulong)(uint)(iVar8 * 2);
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(uVar9 * 8);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar3->pArray,uVar9 * 8);
          }
          pVVar3->pArray = ppvVar4;
          pVVar3->nCap = iVar8 * 2;
        }
      }
      else {
        ppvVar4 = pVVar3->pArray;
      }
      uVar6 = uVar7 & 0xffffffff;
      uVar7 = uVar7 + 1;
      pVVar3->nSize = (int)uVar7;
      ppvVar4[uVar6] = vSupport;
    } while ((long)uVar7 < (long)vParts->nSize);
  }
  Aig_ManCleanCioIds(p);
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Aig_ManSupportNodes( Aig_Man_t * p, Vec_Ptr_t * vParts )
{
    Vec_Ptr_t * vPartSupps;
    Vec_Int_t * vPart, * vSupport;
    int i, k, iOut;
    Aig_ManSetCioIds( p );
    vPartSupps = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vPart, i )
    {
        vSupport = Vec_IntAlloc( 100 );
        Aig_ManIncrementTravId( p );
        Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
        Vec_IntForEachEntry( vPart, iOut, k )
            Aig_ManSupportNodes_rec( p, Aig_ObjFanin0(Aig_ManCo(p, iOut)), vSupport );
//        Vec_IntSort( vSupport, 0 );
        Vec_PtrPush( vPartSupps, vSupport );
    }
    Aig_ManCleanCioIds( p );
    return vPartSupps;
}